

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.h
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::NextFloatOfRow::operator()
          (NextFloatOfRow *this,iterator_t *str,iterator_t *end)

{
  ParserDPOMDPFormat_Spirit *pPVar1;
  pointer pvVar2;
  iterator __position;
  long *plVar3;
  double d;
  double local_18;
  
  if (this->_m_po->_m_lp_type != DOUBLE) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"NextFloatOfRow - ERROR parsing probabilities, which",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," means that doubles are expected, however last found",0x34);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," type is #",10);
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->_m_po->_m_lp_type);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  pPVar1 = this->_m_po;
  pvVar2 = (pPVar1->_m_curMatrix).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar2 != (pPVar1->_m_curMatrix).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    local_18 = pPVar1->_m_lp_double;
    __position._M_current =
         pvVar2[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        pvVar2[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)(pvVar2 + -1),__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pvVar2[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish = __position._M_current + 1;
    }
    this->_m_po->_m_matrixModified = true;
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"NextFloatOfRow - ERROR _m_curMatrix contains no ",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"elements (i.e. there are no rows to add to...).",0x2f);
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(_m_po->_m_lp_type != DOUBLE)
                {
                    std::cout <<"NextFloatOfRow - ERROR parsing probabilities, which"
                        <<" means that doubles are expected, however last found"
                        <<" type is #"<<_m_po->_m_lp_type<<std::endl;
                }
                if(DEBUG_PARSE){//DEBUG
                    Index s =_m_po->_m_curMatrix.size();
                    std::cout <<" _m_po->_m_curMatrix.size()= " << s <<std::endl;
                    if(s>0)
                    std::cout <<" _m_po->_m_curMatrix.back().size()= " <<
                        _m_po->_m_curMatrix.back().size()<<std::endl;
                }
                size_t s =_m_po->_m_curMatrix.size();
                if(s > 0)
                {
                    double d = _m_po->_m_lp_double;
                    //_m_curMatrix.back() isa  vector<double>
                    _m_po->_m_curMatrix.back().push_back(d);
                    _m_po->_m_matrixModified = true;
                }
                else
                    std::cout << "NextFloatOfRow - ERROR _m_curMatrix contains no "<<
                        "elements (i.e. there are no rows to add to...).";

                if(DEBUG_PARSE){//DEBUG
                    size_t s =_m_po->_m_curMatrix.size();
                    std::cout <<" _m_po->_m_curMatrix.size()= " << s <<std::endl;
                    if(s>0)
                    std::cout <<" _m_po->_m_curMatrix.back().size()= " <<
                        _m_po->_m_curMatrix.back().size()<<std::endl;
                }

            }